

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockAgentTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::testutils::MockAgent_testSamplingManager_Test::MockAgent_testSamplingManager_Test
          (MockAgent_testSamplingManager_Test *this)

{
  MockAgent_testSamplingManager_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__MockAgent_testSamplingManager_Test_003b2fd8;
  return;
}

Assistant:

TEST(MockAgent, testSamplingManager)
{
    auto mockAgent = MockAgent::make();
    mockAgent->start();

    {
        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << '/';
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto response = net::http::get(uri);
        ASSERT_EQ("no 'service' parameter", response.body());
    }
    {
        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << "/?service=a&service=b";
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto response = net::http::get(uri);
        ASSERT_EQ("'service' parameter must occur only once", response.body());
    }
    {
        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << "/?service=something";
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto responseHTTP = net::http::get(uri);
        sampling_manager::thrift::SamplingStrategyResponse response;
        response = nlohmann::json::parse(responseHTTP.body());
        ASSERT_EQ(sampling_manager::thrift::SamplingStrategyType::PROBABILISTIC,
                  response.strategyType);
    }
    {
        sampling_manager::thrift::SamplingStrategyResponse config;
        config.__set_strategyType(
            sampling_manager::thrift::SamplingStrategyType::RATE_LIMITING);
        sampling_manager::thrift::RateLimitingSamplingStrategy rateLimiting;
        rateLimiting.__set_maxTracesPerSecond(123);
        config.__set_rateLimitingSampling(rateLimiting);
        mockAgent->addSamplingStrategy("service123", config);

        std::ostringstream oss;
        oss << "http://" << mockAgent->samplingServerAddress().authority()
            << "/?service=service123";
        const auto uriStr = oss.str();
        const auto uri = net::URI::parse(uriStr);
        const auto responseHTTP = net::http::get(uri);
        sampling_manager::thrift::SamplingStrategyResponse response;
        response = nlohmann::json::parse(responseHTTP.body());
        ASSERT_EQ(config, response);
    }
}